

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

uint128 * __thiscall trng::portable_impl::uint128::operator<<=(uint128 *this,int s)

{
  int in_ECX;
  uint128 uVar1;
  
  uVar1.m_hi._0_4_ = s;
  uVar1.m_lo = this->m_hi;
  uVar1.m_hi._4_4_ = 0;
  uVar1 = portable_impl::operator<<((portable_impl *)this->m_lo,uVar1,in_ECX);
  *this = uVar1;
  return this;
}

Assistant:

uint128 &operator<<=(int s) {
        const uint128 result(*this << s);
        *this = result;
        return *this;
      }